

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigMem.c
# Opt level: O2

void Fraig_MemFixedRestart(Fraig_MemFixed_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  
  for (lVar5 = 1; lVar5 < p->nChunks; lVar5 = lVar5 + 1) {
    if (p->pChunks[lVar5] != (char *)0x0) {
      free(p->pChunks[lVar5]);
      p->pChunks[lVar5] = (char *)0x0;
    }
  }
  p->nChunks = 1;
  iVar1 = p->nChunkSize;
  pcVar4 = *p->pChunks;
  for (iVar3 = 1; iVar3 < iVar1; iVar3 = iVar3 + 1) {
    iVar2 = p->nEntrySize;
    *(char **)pcVar4 = pcVar4 + iVar2;
    pcVar4 = pcVar4 + iVar2;
  }
  pcVar4[0] = '\0';
  pcVar4[1] = '\0';
  pcVar4[2] = '\0';
  pcVar4[3] = '\0';
  pcVar4[4] = '\0';
  pcVar4[5] = '\0';
  pcVar4[6] = '\0';
  pcVar4[7] = '\0';
  p->pEntriesFree = *p->pChunks;
  p->nMemoryAlloc = p->nEntrySize * iVar1;
  p->nMemoryUsed = 0;
  p->nEntriesAlloc = iVar1;
  p->nEntriesUsed = 0;
  return;
}

Assistant:

void Fraig_MemFixedRestart( Fraig_MemFixed_t * p )
{
    int i;
    char * pTemp;

    // deallocate all chunks except the first one
    for ( i = 1; i < p->nChunks; i++ )
        ABC_FREE( p->pChunks[i] );
    p->nChunks = 1;
    // transform these entries into a linked list
    pTemp = p->pChunks[0];
    for ( i = 1; i < p->nChunkSize; i++ )
    {
        *((char **)pTemp) = pTemp + p->nEntrySize;
        pTemp += p->nEntrySize;
    }
    // set the last link
    *((char **)pTemp) = NULL;
    // set the free entry list
    p->pEntriesFree  = p->pChunks[0];
    // set the correct statistics
    p->nMemoryAlloc  = p->nEntrySize * p->nChunkSize;
    p->nMemoryUsed   = 0;
    p->nEntriesAlloc = p->nChunkSize;
    p->nEntriesUsed  = 0;
}